

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameLoop.cpp
# Opt level: O0

void GameLoop(Maze *maze)

{
  int iVar1;
  ostream *poVar2;
  Room *pRVar3;
  Room *pRVar4;
  bool bVar5;
  byte local_72;
  Room *tmpRoom_3;
  Room *tmpRoom_2;
  Room *tmpRoom_1;
  Room *tmpRoom;
  undefined1 local_40 [44];
  char command;
  char labels;
  bool displayLabels;
  bool exit;
  Room *currentRoom;
  Maze *maze_local;
  
  currentRoom = (Room *)maze;
  register0x00000000 = Maze::GetStart(maze);
  local_40[0x27] = 0;
  poVar2 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"Welcome to the maze game! Use command x to E(x)it at any time.");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  do {
    std::operator<<((ostream *)&std::cout,"Do you want room labels turned on? (y/n): ");
    iVar1 = getchar();
    local_40[0x25] = (char)iVar1;
    std::istream::ignore((long)&std::cin,1000);
    iVar1 = tolower((int)local_40[0x25]);
    if (iVar1 == 0x79) {
      local_40[0x26] = 1;
    }
    else {
      iVar1 = tolower((int)local_40[0x25]);
      if (iVar1 == 0x6e) {
        local_40[0x26] = 0;
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,"Invalid input, try again.");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
    }
    iVar1 = tolower((int)local_40[0x25]);
    bVar5 = false;
    if (iVar1 != 0x79) {
      iVar1 = tolower((int)local_40[0x25]);
      bVar5 = iVar1 != 0x6e;
    }
  } while (bVar5);
  while( true ) {
    pRVar4 = stack0xffffffffffffffe8;
    pRVar3 = Maze::GetEnd((Maze *)currentRoom);
    local_72 = 0;
    if (pRVar4 != pRVar3) {
      local_72 = local_40[0x27] ^ 0xff;
    }
    if ((local_72 & 1) == 0) break;
    if ((local_40[0x26] & 1) == 0) {
      poVar2 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<(poVar2,"You are in a room");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar2 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<(poVar2,"You are in a room with label: \'");
      Room::GetLabel_abi_cxx11_((Room *)local_40);
      poVar2 = std::operator<<(poVar2,(string *)local_40);
      poVar2 = std::operator<<(poVar2,"\'");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_40);
    }
    std::operator<<((ostream *)&std::cout,"You can go: ");
    pRVar4 = Room::GetRoom(stack0xffffffffffffffe8,NORTH);
    if (pRVar4 != (Room *)0x0) {
      std::operator<<((ostream *)&std::cout,"(n)orth  ");
    }
    pRVar4 = Room::GetRoom(stack0xffffffffffffffe8,EAST);
    if (pRVar4 != (Room *)0x0) {
      std::operator<<((ostream *)&std::cout,"(e)ast  ");
    }
    pRVar4 = Room::GetRoom(stack0xffffffffffffffe8,SOUTH);
    if (pRVar4 != (Room *)0x0) {
      std::operator<<((ostream *)&std::cout,"(s)outh  ");
    }
    pRVar4 = Room::GetRoom(stack0xffffffffffffffe8,WEST);
    if (pRVar4 != (Room *)0x0) {
      std::operator<<((ostream *)&std::cout,"(w)est  ");
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"Please enter your command: ");
    iVar1 = getchar();
    local_40[0x24] = (char)iVar1;
    std::istream::ignore((long)&std::cin,1000);
    iVar1 = tolower((int)local_40[0x24]);
    switch(iVar1) {
    case 0x65:
      pRVar4 = Room::GetRoom(stack0xffffffffffffffe8,EAST);
      if (pRVar4 == (Room *)0x0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"You cannot go that way.");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,"Moving one room to the east.");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        unique0x1000078c = pRVar4;
      }
      break;
    default:
      poVar2 = std::operator<<((ostream *)&std::cout,"Invalid command!");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      break;
    case 0x6e:
      pRVar4 = Room::GetRoom(stack0xffffffffffffffe8,NORTH);
      if (pRVar4 == (Room *)0x0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"You cannot go that way.");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,"Moving one room to the north.");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        unique0x1000077c = pRVar4;
      }
      break;
    case 0x73:
      pRVar4 = Room::GetRoom(stack0xffffffffffffffe8,SOUTH);
      if (pRVar4 == (Room *)0x0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"You cannot go that way.");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,"Moving one room to the south.");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        unique0x1000076c = pRVar4;
      }
      break;
    case 0x77:
      pRVar4 = Room::GetRoom(stack0xffffffffffffffe8,WEST);
      if (pRVar4 == (Room *)0x0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"You cannot go that way.");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,"Moving one room to the west.");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        unique0x1000075c = pRVar4;
      }
      break;
    case 0x78:
      local_40[0x27] = 1;
    }
  }
  if ((local_40[0x27] & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "Congratulations! You made it to the end! Now exiting.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"We hope you come to play again!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void GameLoop(Maze* maze)
{
    Room* currentRoom = maze->GetStart();
    bool exit = false;
    bool displayLabels;
    char labels;

    std::cout << std::endl << "Welcome to the maze game! Use command x to E(x)it at any time." << std::endl << std::endl;

    do
    {
        std::cout << "Do you want room labels turned on? (y/n): ";
        labels = std::getchar();
        std::cin.ignore(1000, '\n');

        if(tolower(labels) == 'y')
            displayLabels = true;
        else if(tolower(labels) == 'n')
            displayLabels = false;
        else
            std::cout << "Invalid input, try again." << std::endl << std::endl;

    } while(tolower(labels) != 'y' && tolower(labels) != 'n');

    while(currentRoom != maze->GetEnd() && !exit)
    {
        char command;

        if(displayLabels)
            std::cout << std::endl << "You are in a room with label: '" << currentRoom->GetLabel() << "'"<< std::endl;
        else
            std::cout << std::endl << "You are in a room" << std::endl;
        std::cout << "You can go: ";
        if(currentRoom->GetRoom(NORTH) != NULL)
            std::cout << "(n)orth  ";
        if(currentRoom->GetRoom(EAST) != NULL)
            std::cout << "(e)ast  ";
        if(currentRoom->GetRoom(SOUTH) != NULL)
            std::cout << "(s)outh  ";
        if(currentRoom->GetRoom(WEST) != NULL)
            std::cout << "(w)est  ";
        std::cout << std::endl;

        std::cout << "Please enter your command: ";
        command = std::getchar();
        std::cin.ignore(1000, '\n');

        switch(tolower(command))
        {
            case 'n':
            {
                Room *tmpRoom = currentRoom->GetRoom(NORTH);
                if (tmpRoom == NULL)
                    std::cout << "You cannot go that way." << std::endl;
                else
                {
                    std::cout << "Moving one room to the north." << std::endl;
                    currentRoom = tmpRoom;
                }

                break;
            }
            case 'e':
            {
                Room *tmpRoom = currentRoom->GetRoom(EAST);
                if (tmpRoom == NULL)
                    std::cout << "You cannot go that way." << std::endl;
                else
                {
                    std::cout << "Moving one room to the east." << std::endl;
                    currentRoom = tmpRoom;
                }

                break;
            }
            case 's':
            {
                Room *tmpRoom = currentRoom->GetRoom(SOUTH);
                if (tmpRoom == NULL)
                    std::cout << "You cannot go that way." << std::endl;
                else
                {
                    std::cout << "Moving one room to the south." << std::endl;
                    currentRoom = tmpRoom;
                }

                break;
            }
            case 'w':
            {
                Room *tmpRoom = currentRoom->GetRoom(WEST);
                if (tmpRoom == NULL)
                    std::cout << "You cannot go that way." << std::endl;
                else
                {
                    std::cout << "Moving one room to the west." << std::endl;
                    currentRoom = tmpRoom;
                }

                break;
            }
            case 'x':
            {
                exit = true;
                break;
            }
            default:
            {
                std::cout << "Invalid command!" << std::endl;
            }
        }

    }

    if(exit)
    {
        std::cout << "We hope you come to play again!" << std::endl;
    }
    else
    {
        std::cout << "Congratulations! You made it to the end! Now exiting." << std::endl;
        return;
    }
}